

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<float,float>(Thread *this,BinopFunc<float,_float> *f)

{
  float *pfVar1;
  float fVar2;
  Simd<float,_(unsigned_char)__x04_> SVar3;
  byte local_49;
  undefined1 auStack_48 [7];
  u8 i;
  SR result;
  Simd<float,_(unsigned_char)__x04_> lhs;
  Simd<float,_(unsigned_char)__x04_> rhs;
  BinopFunc<float,_float> *f_local;
  Thread *this_local;
  
  SVar3 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  lhs.v._8_8_ = SVar3.v._0_8_;
  SVar3 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  lhs.v._0_8_ = SVar3.v._8_8_;
  result.v._8_8_ = SVar3.v._0_8_;
  for (local_49 = 0; local_49 < 4; local_49 = local_49 + 1) {
    pfVar1 = Simd<float,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<float,_(unsigned_char)__x04_> *)(result.v + 2),local_49);
    fVar2 = *pfVar1;
    pfVar1 = Simd<float,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<float,_(unsigned_char)__x04_> *)(lhs.v + 2),local_49);
    fVar2 = (*f)(fVar2,*pfVar1);
    pfVar1 = Simd<float,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<float,_(unsigned_char)__x04_> *)auStack_48,local_49);
    *pfVar1 = fVar2;
  }
  SVar3.v[2] = result.v[0];
  SVar3.v[3] = result.v[1];
  SVar3.v[0] = (float)auStack_48._0_4_;
  SVar3.v[1] = stack0xffffffffffffffbc;
  Push<wabt::interp::Simd<float,(unsigned_char)4>>(this,SVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}